

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O2

void adt_hnode_destroy(adt_hnode_t *node,_func_void_void_ptr *pDestructor)

{
  adt_hkey_tag *paVar1;
  adt_hkey_t *hkey;
  adt_hmatch_t *__ptr;
  int i;
  ulong uVar2;
  long lVar3;
  
  if (node->u8Width < 0x10) {
    for (uVar2 = 0; __ptr = (node->child).match, uVar2 < node->u8Cur; uVar2 = uVar2 + 1) {
      hkey = __ptr[uVar2].key;
      while (hkey != (adt_hkey_t *)0x0) {
        paVar1 = hkey->next;
        adt_hkey_delete(hkey,pDestructor);
        hkey = paVar1;
      }
    }
  }
  else {
    if (node->u8Width != 0x10) {
      __assert_fail("node->u8Width==16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,300,"void adt_hnode_destroy(adt_hnode_t *, void (*)(void *))");
    }
    for (lVar3 = 0; __ptr = (node->child).match, lVar3 != 0x100; lVar3 = lVar3 + 0x10) {
      adt_hnode_destroy((adt_hnode_t *)((long)&__ptr->u32Hash + lVar3),pDestructor);
    }
  }
  free(__ptr);
  return;
}

Assistant:

void adt_hnode_destroy(adt_hnode_t *node,void (*pDestructor)(void*)){
	if(node->u8Width<16){
		int i;
		for(i=0;i<node->u8Cur;i++){
			adt_hkey_t *hkey = node->child.match[i].key;
			while( hkey ){
				adt_hkey_t *next = hkey->next;
				adt_hkey_delete(hkey,pDestructor);
				hkey = next;
			}
		}
		free(node->child.match);
	}
	else{
      uint8_t i;
      assert(node->u8Width==16);
		for(i=0;i<16;i++){
			adt_hnode_destroy(&node->child.node[i],pDestructor);
		}
		free(node->child.node);
	}
}